

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
::~InstanceFactory1(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
                    *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstanceFactory1_00ceda98;
  pcVar2 = (this->m_arg0).arg0.binaryName._M_dataplus._M_p;
  paVar1 = &(this->m_arg0).arg0.binaryName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

InstanceFactory1	(tcu::TestContext& testCtx, tcu::TestNodeType type, const std::string& name, const std::string& desc, const Arg0& arg0)
						: TestCase	(testCtx, type, name, desc)
						, m_progs	()
						, m_arg0	(arg0)
					{}